

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O3

double cos(double __x)

{
  double dVar1;
  S2LogMessage SStack_18;
  
  dVar1 = ABS(__x);
  if ((0x3fe < (uint)((long)dVar1 + 0xfff0000000000000U >> 0x35) || -1 < (long)__x) &&
      (dVar1 != INFINITY && (0xffffffffffffe < (long)dVar1 - 1U || -1 < (long)__x))) {
    return __x * -0.5 + 1.0;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
             ,0x95,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: !a.is_special() ",0x1e);
  abort();
}

Assistant:

double cos(S1ChordAngle a) {
  // cos(2*A) = cos^2(A) - sin^2(A) = 1 - 2*sin^2(A)
  S2_DCHECK(!a.is_special());
  return 1 - 0.5 * a.length2();
}